

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O1

bool __thiscall gjkepa2_impl::EPA::getedgedist(EPA *this,sFace *face,sSV *a,sSV *b,btScalar *dist)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  btScalar bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar7 = (b->w).m_floats[0];
  fVar1 = (b->w).m_floats[1];
  fVar2 = (a->w).m_floats[0];
  fVar3 = (a->w).m_floats[1];
  fVar10 = fVar7 - fVar2;
  fVar12 = fVar1 - fVar3;
  fVar4 = (b->w).m_floats[2];
  fVar5 = (a->w).m_floats[2];
  fVar9 = fVar4 - fVar5;
  fVar13 = (face->n).m_floats[2];
  fVar11 = (face->n).m_floats[0];
  fVar6 = (face->n).m_floats[1];
  fVar13 = (fVar6 * fVar10 - fVar11 * fVar12) * fVar5 +
           (fVar12 * fVar13 - fVar6 * fVar9) * fVar2 + (fVar9 * fVar11 - fVar13 * fVar10) * fVar3;
  if (fVar13 < 0.0) {
    if (fVar5 * fVar9 + fVar2 * fVar10 + fVar3 * fVar12 <= 0.0) {
      if (0.0 <= fVar4 * fVar9 + fVar7 * fVar10 + fVar1 * fVar12) {
        fVar11 = fVar5 * fVar4 + fVar2 * fVar7 + fVar1 * fVar3;
        fVar7 = ((fVar4 * fVar4 + fVar7 * fVar7 + fVar1 * fVar1) *
                 (fVar5 * fVar5 + fVar2 * fVar2 + fVar3 * fVar3) - fVar11 * fVar11) /
                (fVar9 * fVar9 + fVar10 * fVar10 + fVar12 * fVar12);
        if (fVar7 <= 0.0) {
          fVar7 = 0.0;
        }
      }
      else {
        fVar7 = fVar4 * fVar4 + fVar7 * fVar7 + fVar1 * fVar1;
      }
    }
    else {
      fVar7 = fVar5 * fVar5 + fVar2 * fVar2 + fVar3 * fVar3;
    }
    if (fVar7 < 0.0) {
      bVar8 = sqrtf(fVar7);
    }
    else {
      bVar8 = SQRT(fVar7);
    }
    *dist = bVar8;
  }
  return fVar13 < 0.0;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator-(const btVector3& v1, const btVector3& v2)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API)  && defined(BT_USE_SSE))

	//	without _mm_and_ps this code causes slowdown in Concave moving
	__m128 r = _mm_sub_ps(v1.mVec128, v2.mVec128);
	return btVector3(_mm_and_ps(r, btvFFF0fMask));
#elif defined(BT_USE_NEON)
	float32x4_t r = vsubq_f32(v1.mVec128, v2.mVec128);
	return btVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return btVector3(
			v1.m_floats[0] - v2.m_floats[0],
			v1.m_floats[1] - v2.m_floats[1],
			v1.m_floats[2] - v2.m_floats[2]);
#endif
}